

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::FloatingPointLE<float>(char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  String *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  AssertionResult AVar6;
  stringstream val2_ss;
  stringstream val1_ss;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  FloatingPoint<float> *in_stack_fffffffffffffc00;
  FloatingPoint<float> *in_stack_fffffffffffffc08;
  char (*in_stack_fffffffffffffc28) [12];
  AssertionResult *in_stack_fffffffffffffc30;
  stringstream local_350 [16];
  ostream local_340 [328];
  stringstream *in_stack_fffffffffffffe08;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  FloatingPoint<float> local_28;
  FloatingPoint<float> local_24;
  float local_20;
  float local_1c [7];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  
  if (in_XMM1_Da <= in_XMM0_Da) {
    local_20 = in_XMM1_Da;
    local_1c[0] = in_XMM0_Da;
    FloatingPoint<float>::FloatingPoint(&local_24,local_1c);
    FloatingPoint<float>::FloatingPoint(&local_28,&local_20);
    bVar1 = FloatingPoint<float>::AlmostEquals(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    if (bVar1) {
      AVar6 = AssertionSuccess();
      sVar5 = AVar6.message_.ptr_;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b0);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(local_1a0,_Var2);
      std::ostream::operator<<(poVar3,local_1c[0]);
      std::__cxx11::stringstream::stringstream(local_350);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(local_340,_Var2);
      std::ostream::operator<<(poVar3,local_20);
      AssertionFailure();
      this = AssertionResult::operator<<(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      other = AssertionResult::operator<<
                        (in_stack_fffffffffffffc30,(char **)in_stack_fffffffffffffc28);
      this_00 = AssertionResult::operator<<
                          (in_stack_fffffffffffffc30,(char (*) [7])in_stack_fffffffffffffc28);
      pSVar4 = (String *)AssertionResult::operator<<(this_00,(char **)in_stack_fffffffffffffc28);
      AssertionResult::operator<<(this_00,(char (*) [3])pSVar4);
      AssertionResult::operator<<(this_00,(char (*) [11])pSVar4);
      StringStreamToString(in_stack_fffffffffffffe08);
      AssertionResult::operator<<(this_00,pSVar4);
      AssertionResult::operator<<(this_00,(char (*) [5])pSVar4);
      StringStreamToString(in_stack_fffffffffffffe08);
      pSVar4 = (String *)AssertionResult::operator<<(this_00,pSVar4);
      AssertionResult::AssertionResult(this,other);
      String::~String(pSVar4);
      String::~String(pSVar4);
      AssertionResult::~AssertionResult((AssertionResult *)0x25407e);
      std::__cxx11::stringstream::~stringstream(local_350);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      sVar5.ptr_ = extraout_RDX;
    }
  }
  else {
    AVar6 = AssertionSuccess();
    sVar5 = AVar6.message_.ptr_;
  }
  AVar6.message_.ptr_ = sVar5.ptr_;
  AVar6._0_8_ = in_RDI;
  return AVar6;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}